

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkGetErrWeights(void *arkode_mem,N_Vector eweight)

{
  realtype in_RDI;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0.0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkGetErrWeights","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    N_VScale(in_RDI,in_stack_ffffffffffffffd8,(N_Vector)0x114b74d);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkGetErrWeights(void *arkode_mem, N_Vector eweight)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkGetErrWeights", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  N_VScale(ONE, ark_mem->ewt, eweight);
  return(ARK_SUCCESS);
}